

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

int xmlSAXUserParseFile(xmlSAXHandlerPtr sax,void *user_data,char *filename)

{
  xmlParserCtxtPtr ctxt;
  size_t __n;
  uint uVar1;
  _xmlSAXHandler *__s;
  
  ctxt = xmlCreateURLParserCtxt(filename,0);
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    uVar1 = 0xffffffff;
  }
  else {
    if (sax != (xmlSAXHandlerPtr)0x0) {
      __s = ctxt->sax;
      __n = 0x100;
      if (sax->initialized != 0xdeedbeaf) {
        memset(__s,0,0x100);
        __s = ctxt->sax;
        __n = 0xe0;
      }
      memcpy(__s,sax,__n);
      ctxt->userData = user_data;
    }
    xmlParseDocument(ctxt);
    uVar1 = 0;
    if (ctxt->wellFormed == 0) {
      uVar1 = -(uint)(ctxt->errNo == 0) | ctxt->errNo;
    }
    if (ctxt->myDoc != (xmlDocPtr)0x0) {
      xmlFreeDoc(ctxt->myDoc);
      ctxt->myDoc = (xmlDocPtr)0x0;
    }
    xmlFreeParserCtxt(ctxt);
  }
  return uVar1;
}

Assistant:

int
xmlSAXUserParseFile(xmlSAXHandlerPtr sax, void *user_data,
                    const char *filename) {
    int ret = 0;
    xmlParserCtxtPtr ctxt;

    ctxt = xmlCreateFileParserCtxt(filename);
    if (ctxt == NULL) return -1;
    if (sax != NULL) {
        if (sax->initialized == XML_SAX2_MAGIC) {
            *ctxt->sax = *sax;
        } else {
            memset(ctxt->sax, 0, sizeof(*ctxt->sax));
            memcpy(ctxt->sax, sax, sizeof(xmlSAXHandlerV1));
        }
	ctxt->userData = user_data;
    }

    xmlParseDocument(ctxt);

    if (ctxt->wellFormed)
	ret = 0;
    else {
        if (ctxt->errNo != 0)
	    ret = ctxt->errNo;
	else
	    ret = -1;
    }
    if (ctxt->myDoc != NULL) {
        xmlFreeDoc(ctxt->myDoc);
	ctxt->myDoc = NULL;
    }
    xmlFreeParserCtxt(ctxt);

    return ret;
}